

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadFunctions.cpp
# Opt level: O0

void __thiscall
Producer::operator()(Producer *this,Queue<int> *q,TimeT startTime,TimeT period,int noMessages)

{
  int local_40;
  int local_3c;
  undefined8 uStack_38;
  int i;
  time_point start;
  int noMessages_local;
  Queue<int> *q_local;
  Producer *this_local;
  TimeT period_local;
  TimeT startTime_local;
  
  start.__d.__r._4_4_ = noMessages;
  this_local = (Producer *)period.__r;
  period_local = startTime;
  uStack_38 = std::chrono::_V2::system_clock::now();
  std::vector<int,_std::allocator<int>_>::reserve(&this->producedValues,200);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&period_local);
  for (local_3c = 1; local_3c <= start.__d.__r._4_4_; local_3c = local_3c + 1) {
    rtb::Concurrency::Queue<int>::push(q,&local_3c);
    std::vector<int,_std::allocator<int>_>::push_back(&this->producedValues,&local_3c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&this_local);
  }
  local_40 = std::numeric_limits<int>::max();
  rtb::Concurrency::Queue<int>::push(q,&local_40);
  return;
}

Assistant:

void Producer::operator()(Queue<int> &q, TimeT startTime, TimeT period, int noMessages) {
    auto start = std::chrono::system_clock::now();
    producedValues.reserve(200);
    std::this_thread::sleep_for(startTime);

    for (int i = 1; i <= noMessages; ++i) {
        q.push(i);
        producedValues.push_back(i);
        std::this_thread::sleep_for(period);
    }
    q.push(std::numeric_limits<int>::max());
}